

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

int oneortwodigit(char *date,char **endp)

{
  char cVar1;
  
  cVar1 = *date;
  if ((byte)(date[1] - 0x30U) < 10) {
    *endp = date + 2;
    return (cVar1 + -0x30) * 10 + (int)date[1] + -0x30;
  }
  *endp = date + 1;
  return cVar1 + -0x30;
}

Assistant:

static int oneortwodigit(const char *date, const char **endp)
{
  int num = date[0] - '0';
  if(ISDIGIT(date[1])) {
    *endp = &date[2];
    return num*10 + (date[1] - '0');
  }
  *endp = &date[1];
  return num;
}